

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O0

void __thiscall
simdjson::internal::unsupported_implementation::unsupported_implementation
          (unsupported_implementation *this)

{
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  unsupported_implementation *local_50;
  unsupported_implementation *this_local;
  allocator<char> local_35;
  uint32_t local_34;
  unsupported_implementation *local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_50 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"unsupported");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_70,"Unsupported CPU (no detected SIMD instructions)");
  local_18._M_len = local_60._M_len;
  local_18._M_str = local_60._M_str;
  local_28._M_len = local_70._M_len;
  local_28._M_str = local_70._M_str;
  local_34 = 0;
  (this->super_implementation)._vptr_implementation = (_func_int **)&PTR_name_abi_cxx11__00450788;
  local_30 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&(this->super_implementation)._name,&local_18,&local_35);
  std::allocator<char>::~allocator(&local_35);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&(this->super_implementation)._description,&local_28,
             (allocator<char> *)((long)&this_local + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&this_local + 3));
  (this->super_implementation)._required_instruction_sets = local_34;
  (this->super_implementation)._vptr_implementation = (_func_int **)&PTR_name_abi_cxx11__00450840;
  return;
}

Assistant:

unsupported_implementation() : implementation("unsupported", "Unsupported CPU (no detected SIMD instructions)", 0) {}